

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigDup.c
# Opt level: O0

Aig_Man_t * Saig_ManTrimPis(Aig_Man_t *p)

{
  bool bVar1;
  int iVar2;
  void *pvVar3;
  Aig_Man_t *p_00;
  char *pcVar4;
  Vec_Int_t *pVVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pAVar7;
  Aig_Obj_t *p1;
  int local_24;
  int fAllPisHaveNoRefs;
  int i;
  Aig_Obj_t *pObj;
  Aig_Man_t *pNew;
  Aig_Man_t *p_local;
  
  bVar1 = true;
  for (local_24 = 0; iVar2 = Saig_ManPiNum(p), local_24 < iVar2; local_24 = local_24 + 1) {
    pvVar3 = Vec_PtrEntry(p->vCis,local_24);
    if ((*(ulong *)((long)pvVar3 + 0x18) >> 6 & 0x3ffffff) != 0) {
      bVar1 = false;
    }
  }
  iVar2 = Aig_ManObjNum(p);
  p_00 = Aig_ManStart(iVar2);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar4;
  p_00->nConstrs = p->nConstrs;
  iVar2 = Aig_ManCiNum(p);
  pVVar5 = Vec_IntAlloc(iVar2);
  p_00->vCiNumsOrig = pVVar5;
  Aig_ManCleanData(p);
  pAVar6 = Aig_ManConst1(p_00);
  pAVar7 = Aig_ManConst1(p);
  (pAVar7->field_5).pData = pAVar6;
  for (local_24 = 0; iVar2 = Vec_PtrSize(p->vCis), local_24 < iVar2; local_24 = local_24 + 1) {
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p->vCis,local_24);
    if (((bVar1) || ((*(ulong *)&pAVar6->field_0x18 >> 6 & 0x3ffffff) != 0)) ||
       (iVar2 = Saig_ObjIsLo(p,pAVar6), iVar2 != 0)) {
      pAVar7 = Aig_ObjCreateCi(p_00);
      (pAVar6->field_5).pData = pAVar7;
      pVVar5 = p_00->vCiNumsOrig;
      iVar2 = Vec_IntEntry(p->vCiNumsOrig,local_24);
      Vec_IntPush(pVVar5,iVar2);
    }
  }
  for (local_24 = 0; iVar2 = Vec_PtrSize(p->vObjs), local_24 < iVar2; local_24 = local_24 + 1) {
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_24);
    if ((pAVar6 != (Aig_Obj_t *)0x0) && (iVar2 = Aig_ObjIsNode(pAVar6), iVar2 != 0)) {
      pAVar7 = Aig_ObjChild0Copy(pAVar6);
      p1 = Aig_ObjChild1Copy(pAVar6);
      pAVar7 = Aig_And(p_00,pAVar7,p1);
      (pAVar6->field_5).pData = pAVar7;
    }
  }
  for (local_24 = 0; iVar2 = Vec_PtrSize(p->vCos), local_24 < iVar2; local_24 = local_24 + 1) {
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,local_24);
    pAVar7 = Aig_ObjChild0Copy(pAVar6);
    pAVar7 = Aig_ObjCreateCo(p_00,pAVar7);
    (pAVar6->field_5).pData = pAVar7;
  }
  iVar2 = Aig_ManRegNum(p);
  Aig_ManSetRegNum(p_00,iVar2);
  return p_00;
}

Assistant:

Aig_Man_t * Saig_ManTrimPis( Aig_Man_t * p )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj;
    int i, fAllPisHaveNoRefs;
    // check the refs of PIs    
    fAllPisHaveNoRefs = 1;
    Saig_ManForEachPi( p, pObj, i )
        if ( pObj->nRefs )
            fAllPisHaveNoRefs = 0;
    // start the new manager
    pNew = Aig_ManStart( Aig_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->nConstrs = p->nConstrs;
    // start mapping of the CI numbers
    pNew->vCiNumsOrig = Vec_IntAlloc( Aig_ManCiNum(p) );
    // map const and primary inputs
    Aig_ManCleanData( p );
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p, pObj, i )
        if ( fAllPisHaveNoRefs || pObj->nRefs || Saig_ObjIsLo(p, pObj) )
        {
            pObj->pData = Aig_ObjCreateCi( pNew );
            Vec_IntPush( pNew->vCiNumsOrig, Vec_IntEntry(p->vCiNumsOrig, i) );
        }
    Aig_ManForEachNode( p, pObj, i )
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    Aig_ManForEachCo( p, pObj, i )
        pObj->pData = Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(p) );
    return pNew;
}